

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O3

bool __thiscall
glcts::ShaderBitfieldOperationCaseBitfieldExtractUint::test
          (ShaderBitfieldOperationCaseBitfieldExtractUint *this,Data *data)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar4 = (ulong)this->m_components;
  if ((long)uVar4 < 1) {
    return true;
  }
  uVar5 = ~(-1 << ((byte)data->bits & 0x1f));
  if (data->bits == 0x20) {
    uVar5 = 0xffffffff;
  }
  bVar2 = (byte)data->offset;
  if (data->outUvec4[0] != (data->inUvec4[0] >> (bVar2 & 0x1f) & uVar5)) {
    return false;
  }
  uVar1 = 1;
  do {
    uVar3 = uVar1;
    if (uVar4 == uVar3) break;
    uVar1 = uVar3 + 1;
  } while (data->outUvec4[uVar3] == (data->inUvec4[uVar3] >> (bVar2 & 0x1f) & uVar5));
  return uVar4 <= uVar3;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLuint expected =
				(data->inUvec4[i] >> data->offset) & (data->bits == 32 ? 0xFFFFFFFF : ((1 << data->bits) - 1));
			if (data->outUvec4[i] != expected)
			{
				return false;
			}
		}
		return true;
	}